

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall ktx::ValidationContext::validatePaddings(ValidationContext *this)

{
  bool bVar1;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  size_type sVar2;
  pointer pkVar3;
  long in_RDI;
  reverse_iterator it;
  size_t i;
  anon_class_16_2_1291d6ae check;
  size_t position;
  ktx_uint64_t sgdByteLength;
  ktx_uint64_t sgdByteOffset;
  ktx_uint32_t kvdByteLength;
  ktx_uint32_t kvdByteOffset;
  ktx_uint32_t dfdByteLength;
  ktx_uint32_t dfdByteOffset;
  unsigned_long levelIndexSize;
  unsigned_long levelIndexOffset;
  reverse_iterator<__gnu_cxx::__normal_iterator<ktxLevelIndexEntry_*,_std::vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>_>_>
  *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_> *in_stack_fffffffffffffe68;
  allocator<char> *in_stack_fffffffffffffe90;
  allocator<char> *__a;
  char *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  string local_130 [32];
  string local_110 [40];
  undefined1 local_e8 [24];
  string local_d0 [16];
  string *in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  anon_class_16_2_1291d6ae *in_stack_ffffffffffffff58;
  allocator<char> local_71;
  string local_70 [32];
  long *local_50;
  long local_40;
  undefined8 local_38;
  undefined8 local_30;
  uint local_28;
  uint local_24;
  undefined4 local_20;
  undefined4 local_1c;
  long local_18;
  undefined8 local_10;
  
  local_10 = 0x50;
  local_18 = (ulong)*(uint *)(in_RDI + 0x8c) * 0x18;
  local_1c = *(undefined4 *)(in_RDI + 0x68);
  local_20 = *(undefined4 *)(in_RDI + 0x6c);
  local_24 = *(uint *)(in_RDI + 0x70);
  local_28 = *(uint *)(in_RDI + 0x74);
  local_30 = *(undefined8 *)(in_RDI + 0x78);
  local_38 = *(undefined8 *)(in_RDI + 0x80);
  local_40 = local_18 + 0x50;
  local_50 = &local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  validatePaddings::anon_class_16_2_1291d6ae::operator()
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             in_stack_ffffffffffffff40);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  __s = (char *)(ulong)local_24;
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,in_stack_fffffffffffffe90);
  validatePaddings::anon_class_16_2_1291d6ae::operator()
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             in_stack_ffffffffffffff40);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff57);
  __a = (allocator<char> *)(local_e8 + 0x17);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
  validatePaddings::anon_class_16_2_1291d6ae::operator()
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             in_stack_ffffffffffffff40);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)(local_e8 + 0x17));
  sVar2 = std::vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>::size
                    ((vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_> *)
                     (in_RDI + 0x98));
  local_e8._8_8_ = sVar2 - 1;
  std::vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>::rbegin
            (in_stack_fffffffffffffe68);
  while( true ) {
    std::vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>::rend
              (in_stack_fffffffffffffe68);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<ktxLevelIndexEntry_*,_std::vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>_>_>
                             *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    if (!bVar1) break;
    in_stack_fffffffffffffe60 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8;
    pkVar3 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<ktxLevelIndexEntry_*,_std::vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<ktxLevelIndexEntry_*,_std::vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>_>_>
                           *)in_stack_fffffffffffffe60);
    in_stack_fffffffffffffe68 =
         (vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_> *)pkVar3->byteOffset;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<ktxLevelIndexEntry_*,_std::vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>_>_>
    ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<ktxLevelIndexEntry_*,_std::vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>_>_>
                  *)in_stack_fffffffffffffe60);
    local_e8._8_8_ = local_e8._8_8_ - 1;
    std::__cxx11::to_string((unsigned_long)__s);
    std::operator+((char *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    validatePaddings::anon_class_16_2_1291d6ae::operator()
              (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
               in_stack_ffffffffffffff40);
    std::__cxx11::string::~string(local_110);
    std::__cxx11::string::~string(local_130);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<ktxLevelIndexEntry_*,_std::vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<ktxLevelIndexEntry_*,_std::vector<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>_>_>
                  *)in_stack_fffffffffffffe60);
  }
  return;
}

Assistant:

void ValidationContext::validatePaddings() {
    const auto levelIndexOffset = sizeof(KTX_header2);
    const auto levelIndexSize = sizeof(ktxLevelIndexEntry) * numLevels;
    const auto dfdByteOffset = header.dataFormatDescriptor.byteOffset;
    const auto dfdByteLength = header.dataFormatDescriptor.byteLength;
    const auto kvdByteOffset = header.keyValueData.byteOffset;
    const auto kvdByteLength = header.keyValueData.byteLength;
    const auto sgdByteOffset = header.supercompressionGlobalData.byteOffset;
    const auto sgdByteLength = header.supercompressionGlobalData.byteLength;

    size_t position = levelIndexOffset + levelIndexSize;
    const auto check = [&](size_t offset, size_t size, std::string name) {
        if (offset == 0 || size == 0)
            return; // Block is missing, skip

        if (offset < position) {
            position = std::max(position, offset + size);
            return; // Just ignore invalid block placements regarding padding checks
        }

        const auto paddingSize = offset - position;
        const auto buffer = std::make_unique<uint8_t[]>(paddingSize);
        read(position, buffer.get(), paddingSize, "the padding before " + name);

        for (size_t i = 0; i < paddingSize; ++i)
            if (buffer[i] != 0) {
                error(Metadata::PaddingNotZero, buffer[i], fmt::format("before {} at offset {}", name, position + i));
                break; // Only report the first non-zero byte per padding, no need to spam
            }

        position = offset + size;
    };

    check(dfdByteOffset, dfdByteLength, "DFD");
    check(kvdByteOffset, kvdByteLength, "KVD");
    check(sgdByteOffset, sgdByteLength, "SGD");
    size_t i = levelIndices.size() - 1;
    for (auto it = levelIndices.rbegin(); it != levelIndices.rend(); ++it)
        check(it->byteOffset, it->byteLength, "image level " + std::to_string(i--));
}